

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdmiCecAnalyzerResults.cpp
# Opt level: O0

void __thiscall HdmiCecAnalyzerResults::GenOperandBubble(HdmiCecAnalyzerResults *this,Frame *frame)

{
  string local_b8 [39];
  allocator local_91;
  string local_90 [55];
  allocator local_59;
  string local_58 [32];
  undefined1 local_38 [8];
  string dataStr;
  Frame *frame_local;
  HdmiCecAnalyzerResults *this_local;
  
  GetNumberString_abi_cxx11_
            ((HdmiCecAnalyzerResults *)local_38,(U64)this,(int)*(undefined8 *)(frame + 0x10));
  if ((this->mTabular & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,"D",&local_59);
    AddResult(this,(string *)local_58);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"Data",&local_91);
    AddResult(this,(string *)local_90);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
  }
  std::operator+((char *)local_b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"Data ");
  AddResult(this,local_b8);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void HdmiCecAnalyzerResults::GenOperandBubble( const Frame& frame )
{
    std::string dataStr = GetNumberString( frame.mData1, 8 );

    if( !mTabular )
    {
        AddResult( "D" );
        AddResult( "Data" );
    }
    AddResult( "Data " + dataStr );
}